

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

POOL_ctx * POOL_create_advanced(size_t numThreads,size_t queueSize,ZSTD_customMem customMem)

{
  int iVar1;
  int iVar2;
  int iVar3;
  POOL_ctx *ctx;
  POOL_job *pPVar4;
  pthread_t *ppVar5;
  long lVar6;
  size_t i;
  size_t sVar7;
  
  if ((numThreads != 0) &&
     (ctx = (POOL_ctx *)ZSTD_customCalloc(0xf0,customMem), ctx != (POOL_ctx *)0x0)) {
    ctx->queueSize = queueSize + 1;
    pPVar4 = (POOL_job *)ZSTD_customCalloc((queueSize + 1) * 0x10,customMem);
    ctx->queue = pPVar4;
    ctx->numThreadsBusy = 0;
    ctx->queueHead = 0;
    ctx->queueTail = 0;
    ctx->queueEmpty = 1;
    iVar1 = pthread_mutex_init((pthread_mutex_t *)&ctx->queueMutex,(pthread_mutexattr_t *)0x0);
    iVar2 = pthread_cond_init((pthread_cond_t *)&ctx->queuePushCond,(pthread_condattr_t *)0x0);
    iVar3 = pthread_cond_init((pthread_cond_t *)&ctx->queuePopCond,(pthread_condattr_t *)0x0);
    if (iVar3 == 0 && (iVar2 == 0 && iVar1 == 0)) {
      ctx->shutdown = 0;
      ppVar5 = (pthread_t *)ZSTD_customCalloc(numThreads * 8,customMem);
      ctx->threads = ppVar5;
      ctx->threadCapacity = 0;
      (ctx->customMem).customAlloc = customMem.customAlloc;
      (ctx->customMem).customFree = customMem.customFree;
      (ctx->customMem).opaque = customMem.opaque;
      if ((ppVar5 != (pthread_t *)0x0) && (ctx->queue != (POOL_job *)0x0)) {
        lVar6 = 0;
        sVar7 = 0;
        while( true ) {
          if (numThreads == sVar7) {
            ctx->threadCapacity = numThreads;
            ctx->threadLimit = numThreads;
            return ctx;
          }
          iVar1 = pthread_create((pthread_t *)((long)ctx->threads + lVar6),(pthread_attr_t *)0x0,
                                 POOL_thread,ctx);
          if (iVar1 != 0) break;
          sVar7 = sVar7 + 1;
          lVar6 = lVar6 + 8;
        }
        ctx->threadCapacity = sVar7;
      }
    }
    POOL_free(ctx);
  }
  return (POOL_ctx *)0x0;
}

Assistant:

POOL_ctx* POOL_create_advanced(size_t numThreads, size_t queueSize,
                               ZSTD_customMem customMem)
{
    POOL_ctx* ctx;
    /* Check parameters */
    if (!numThreads) { return NULL; }
    /* Allocate the context and zero initialize */
    ctx = (POOL_ctx*)ZSTD_customCalloc(sizeof(POOL_ctx), customMem);
    if (!ctx) { return NULL; }
    /* Initialize the job queue.
     * It needs one extra space since one space is wasted to differentiate
     * empty and full queues.
     */
    ctx->queueSize = queueSize + 1;
    ctx->queue = (POOL_job*)ZSTD_customCalloc(ctx->queueSize * sizeof(POOL_job), customMem);
    ctx->queueHead = 0;
    ctx->queueTail = 0;
    ctx->numThreadsBusy = 0;
    ctx->queueEmpty = 1;
    {
        int error = 0;
        error |= ZSTD_pthread_mutex_init(&ctx->queueMutex, NULL);
        error |= ZSTD_pthread_cond_init(&ctx->queuePushCond, NULL);
        error |= ZSTD_pthread_cond_init(&ctx->queuePopCond, NULL);
        if (error) { POOL_free(ctx); return NULL; }
    }
    ctx->shutdown = 0;
    /* Allocate space for the thread handles */
    ctx->threads = (ZSTD_pthread_t*)ZSTD_customCalloc(numThreads * sizeof(ZSTD_pthread_t), customMem);
    ctx->threadCapacity = 0;
    ctx->customMem = customMem;
    /* Check for errors */
    if (!ctx->threads || !ctx->queue) { POOL_free(ctx); return NULL; }
    /* Initialize the threads */
    {   size_t i;
        for (i = 0; i < numThreads; ++i) {
            if (ZSTD_pthread_create(&ctx->threads[i], NULL, &POOL_thread, ctx)) {
                ctx->threadCapacity = i;
                POOL_free(ctx);
                return NULL;
        }   }
        ctx->threadCapacity = numThreads;
        ctx->threadLimit = numThreads;
    }
    return ctx;
}